

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall
Json::Reader::decodeUnicodeEscapeSequence
          (Reader *this,Token *token,Location *current,Location end,uint *ret_unicode)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long in_RCX;
  long *in_RDX;
  int *in_R8;
  Char c;
  int index;
  int unicode;
  allocator<char> local_91;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  int local_6c;
  undefined4 in_stack_ffffffffffffff98;
  int iVar5;
  undefined4 in_stack_ffffffffffffff9c;
  Token *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  Reader *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (in_RCX - *in_RDX < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    local_1 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,(Location)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  else {
    iVar5 = 0;
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      pcVar2 = (char *)*in_RDX;
      *in_RDX = (long)(pcVar2 + 1);
      cVar1 = *pcVar2;
      iVar5 = iVar5 * 0x10;
      if ((cVar1 < '0') || ('9' < cVar1)) {
        if ((cVar1 < 'a') || ('f' < cVar1)) {
          if ((cVar1 < 'A') || ('F' < cVar1)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                      );
            bVar3 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0,
                             (Location)CONCAT44(in_stack_ffffffffffffff9c,iVar5));
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
            std::allocator<char>::~allocator(&local_91);
            return bVar3;
          }
          iVar4 = cVar1 + -0x37;
        }
        else {
          iVar4 = cVar1 + -0x57;
        }
      }
      else {
        iVar4 = cVar1 + -0x30;
      }
      iVar5 = iVar4 + iVar5;
    }
    *in_R8 = iVar5;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Reader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& ret_unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  int unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  ret_unicode = static_cast<unsigned int>(unicode);
  return true;
}